

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimum.cpp
# Opt level: O0

void __thiscall Minimum<1>::Minimum(Minimum<1> *this,vec<IntView<1>_> *_x,IntView<1> _y)

{
  uint uVar1;
  IntView<1> *pIVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  vec<IntView<1>_> *in_RSI;
  undefined8 *in_RDI;
  int i;
  Propagator *in_stack_ffffffffffffffa0;
  undefined8 *puVar3;
  uint *puVar4;
  int pos;
  undefined4 in_stack_ffffffffffffffb8;
  int local_30;
  
  Propagator::Propagator(in_stack_ffffffffffffffa0);
  Checker::Checker((Checker *)in_stack_ffffffffffffffa0);
  *in_RDI = &PTR__Minimum_0031c2f0;
  in_RDI[3] = &DAT_0031c358;
  puVar4 = (uint *)(in_RDI + 4);
  uVar1 = vec<IntView<1>_>::size(in_RSI);
  *puVar4 = uVar1;
  puVar3 = in_RDI + 5;
  pIVar2 = vec<IntView<1>_>::release(in_RSI);
  *puVar3 = pIVar2;
  in_RDI[6] = in_RDX;
  in_RDI[7] = in_RCX;
  Tint::Tint((Tint *)(in_RDI + 8),-1);
  Tint64_t::Tint64_t((Tint64_t *)(in_RDI + 9),0x7fffffff);
  Tint64_t::Tint64_t((Tint64_t *)(in_RDI + 10),0x7fffffff);
  *(undefined1 *)(in_RDI + 0xb) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 1;
  for (local_30 = 0; pos = (int)((ulong)puVar4 >> 0x20), local_30 < *(int *)(in_RDI + 4);
      local_30 = local_30 + 1) {
    IntView<1>::attach((IntView<1> *)in_RSI,(Propagator *)CONCAT44(uVar1,in_stack_ffffffffffffffb8),
                       pos,(int)puVar4);
  }
  IntView<1>::attach((IntView<1> *)in_RSI,(Propagator *)CONCAT44(uVar1,in_stack_ffffffffffffffb8),
                     pos,(int)puVar4);
  return;
}

Assistant:

Minimum(vec<IntView<U> > _x, IntView<U> _y)
			: sz(_x.size()),
				x(_x.release()),
				y(_y),
				min_max_var(-1),
				min_max(INT_MAX),
				min_fixed(INT_MAX) {
		priority = 1;
		for (int i = 0; i < sz; i++) {
			x[i].attach(this, i, EVENT_LU);
		}
		y.attach(this, sz, EVENT_L);
	}